

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  undefined1 local_68 [8];
  secp256k1_modinv64_signed62 s;
  secp256k1_fe tmp;
  secp256k1_fe *x_local;
  secp256k1_fe *r_local;
  
  memcpy(s.v + 4,x,0x28);
  secp256k1_fe_normalize((secp256k1_fe *)(s.v + 4));
  secp256k1_fe_to_signed62((secp256k1_modinv64_signed62 *)local_68,(secp256k1_fe *)(s.v + 4));
  secp256k1_modinv64((secp256k1_modinv64_signed62 *)local_68,&secp256k1_const_modinfo_fe);
  secp256k1_fe_from_signed62(r,(secp256k1_modinv64_signed62 *)local_68);
  return;
}

Assistant:

static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    secp256k1_fe tmp;
    secp256k1_modinv64_signed62 s;

    tmp = *x;
    secp256k1_fe_normalize(&tmp);
    secp256k1_fe_to_signed62(&s, &tmp);
    secp256k1_modinv64(&s, &secp256k1_const_modinfo_fe);
    secp256k1_fe_from_signed62(r, &s);

#ifdef VERIFY
    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == secp256k1_fe_normalizes_to_zero(&tmp));
#endif
}